

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnData::InitializeColumn
          (ColumnData *this,PersistentColumnData *column_data,BaseStatistics *target_stats)

{
  CompressionType compression_type;
  BlockManager *block_manager;
  idx_t start;
  idx_t count;
  BaseStatistics statistics;
  __shared_count<(__gnu_cxx::_Lock_policy)2> offset;
  pointer pDVar1;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> segment;
  SegmentLock l;
  _Head_base<0UL,_duckdb::ColumnSegmentState_*,_false> _Var2;
  __atomic_base<unsigned_long> in_stack_ffffffffffffff08;
  idx_t iVar3;
  __atomic_base<unsigned_long> in_stack_ffffffffffffff10;
  atomic<duckdb::ColumnSegment_*> __m;
  LogicalType *type;
  pointer pDVar4;
  DatabaseInstance *db;
  unique_lock<std::mutex> local_98;
  BaseStatistics local_88;
  
  LOCK();
  (this->count).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  pDVar4 = (column_data->pointers).
           super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
           super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  type = &this->type;
  __m._M_b._M_p =
       (__base_type)&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock;
  for (pDVar1 = (column_data->pointers).
                super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
                super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
                _M_impl.super__Vector_impl_data._M_start; pDVar1 != pDVar4; pDVar1 = pDVar1 + 1) {
    LOCK();
    (this->count).super___atomic_base<unsigned_long>._M_i =
         (this->count).super___atomic_base<unsigned_long>._M_i + pDVar1->tuple_count;
    UNLOCK();
    BaseStatistics::Merge(target_stats,&pDVar1->statistics);
    block_manager = this->block_manager;
    db = this->info->db->db;
    iVar3 = (pDVar1->block_pointer).block_id;
    offset._M_pi._4_4_ = 0;
    offset._M_pi._0_4_ = (pDVar1->block_pointer).offset;
    start = pDVar1->row_start;
    count = pDVar1->tuple_count;
    compression_type = pDVar1->compression_type;
    BaseStatistics::BaseStatistics(&local_88,&pDVar1->statistics);
    _Var2._M_head_impl =
         (pDVar1->segment_state).
         super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
         .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl;
    (pDVar1->segment_state).
    super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
    .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl =
         (ColumnSegmentState *)0x0;
    statistics.type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&stack0xffffffffffffff00;
    statistics.type._0_8_ = &local_88;
    statistics.type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var2._M_head_impl;
    statistics.has_null = (bool)(char)in_stack_ffffffffffffff08._M_i;
    statistics.has_no_null = (bool)(char)(in_stack_ffffffffffffff08._M_i >> 8);
    statistics._26_6_ = (int6)(in_stack_ffffffffffffff08._M_i >> 0x10);
    statistics.distinct_count = in_stack_ffffffffffffff10._M_i;
    statistics.stats_union.string_data.min = (data_t  [8])__m._M_b._M_p;
    statistics.stats_union.string_data.max = (data_t  [8])type;
    statistics.stats_union._16_8_ = target_stats;
    statistics.stats_union._24_8_ = pDVar4;
    statistics.stats_union._32_8_ = db;
    statistics.child_stats.
    super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>._M_t.
    super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
    .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
         (unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>)
         (unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>)
         offset._M_pi;
    ColumnSegment::CreatePersistentSegment
              ((ColumnSegment *)&stack0xffffffffffffff08,db,block_manager,iVar3,(idx_t)offset._M_pi,
               type,start,count,compression_type,statistics,
               (unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true>
                )iVar3);
    if (_Var2._M_head_impl != (ColumnSegmentState *)0x0) {
      (*(_Var2._M_head_impl)->_vptr_ColumnSegmentState[1])();
    }
    BaseStatistics::~BaseStatistics(&local_88);
    ::std::unique_lock<std::mutex>::unique_lock(&local_98,(mutex_type *)__m._M_b._M_p);
    iVar3 = 0;
    AppendSegment(this,(SegmentLock *)&local_98,
                  (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                   *)&stack0xffffffffffffff10);
    ::std::unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::
    ~unique_ptr((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
                &stack0xffffffffffffff10);
    ::std::unique_lock<std::mutex>::~unique_lock(&local_98);
    in_stack_ffffffffffffff10._M_i = in_stack_ffffffffffffff08._M_i;
    ::std::unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::
    ~unique_ptr((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
                &stack0xffffffffffffff08);
    in_stack_ffffffffffffff08._M_i = iVar3;
  }
  return;
}

Assistant:

void ColumnData::InitializeColumn(PersistentColumnData &column_data, BaseStatistics &target_stats) {
	D_ASSERT(type.InternalType() == column_data.physical_type);
	// construct the segments based on the data pointers
	this->count = 0;
	for (auto &data_pointer : column_data.pointers) {
		// Update the count and statistics
		this->count += data_pointer.tuple_count;

		// Merge the statistics. If this is a child column, the target_stats reference will point into the parents stats
		// otherwise if this is a top level column, `stats->statistics` == `target_stats`

		target_stats.Merge(data_pointer.statistics);

		// create a persistent segment
		auto segment = ColumnSegment::CreatePersistentSegment(
		    GetDatabase(), block_manager, data_pointer.block_pointer.block_id, data_pointer.block_pointer.offset, type,
		    data_pointer.row_start, data_pointer.tuple_count, data_pointer.compression_type,
		    std::move(data_pointer.statistics), std::move(data_pointer.segment_state));

		auto l = data.Lock();
		AppendSegment(l, std::move(segment));
	}
}